

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O0

uint __thiscall
crnlib::ktx_texture::add_key_value(ktx_texture *this,char *pKey,void *pVal,uint val_size)

{
  uint uVar1;
  vector<unsigned_char> *this_00;
  size_t sVar2;
  uint8_vec *v;
  uint idx;
  uint val_size_local;
  void *pVal_local;
  char *pKey_local;
  ktx_texture *this_local;
  
  uVar1 = vector<crnlib::vector<unsigned_char>_>::size(&this->m_key_values);
  vector<crnlib::vector<unsigned_char>_>::resize(&this->m_key_values,uVar1 + 1,false);
  this_00 = vector<crnlib::vector<unsigned_char>_>::back(&this->m_key_values);
  sVar2 = strlen(pKey);
  vector<unsigned_char>::append(this_00,(uchar *)pKey,(int)sVar2 + 1);
  vector<unsigned_char>::append(this_00,(uchar *)pVal,val_size);
  return uVar1;
}

Assistant:

uint ktx_texture::add_key_value(const char* pKey, const void* pVal, uint val_size)
    {
        const uint idx = m_key_values.size();
        m_key_values.resize(idx + 1);
        uint8_vec& v = m_key_values.back();
        v.append(reinterpret_cast<const uint8*>(pKey), static_cast<uint>(strlen(pKey)) + 1);
        v.append(static_cast<const uint8*>(pVal), val_size);
        return idx;
    }